

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O1

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  float *pfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  iVar11 = bottom_blob->dims;
  if (iVar11 == 3) {
    iVar11 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar1 = bottom_blob->c;
    Mat::create(top_blob,iVar11,iVar2,uVar1,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar18 = true;
    }
    else {
      bVar18 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar18) {
      return -100;
    }
    uVar13 = iVar2 * iVar11;
    if (this->bias_data_size == 0) {
      if (0 < (int)uVar1) {
        uVar15 = 0;
        do {
          uVar14 = uVar15 & 0xffffffff;
          uVar17 = uVar14;
          if (this->scale_in_data_size == 1) {
            uVar17 = 0;
          }
          if (this->scale_out_data_size == 1) {
            uVar14 = 0;
          }
          if (0 < (int)uVar13) {
            sVar6 = bottom_blob->elemsize;
            sVar7 = top_blob->elemsize;
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
            fVar21 = *(float *)((long)(this->scale_out_data).data + uVar14 * 4);
            sVar8 = top_blob->cstep;
            pvVar3 = top_blob->data;
            sVar9 = bottom_blob->cstep;
            pvVar4 = bottom_blob->data;
            uVar17 = 0;
            do {
              fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4 + sVar6 * sVar9 * uVar15) * fVar22;
              switch(this->activation_type) {
              case 1:
                if (fVar20 <= 0.0) {
                  fVar20 = 0.0;
                }
                break;
              case 2:
                fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar20) & 0x3f800000);
                goto LAB_00484fa0;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar23 = *pfVar5;
                if (fVar20 <= fVar23) {
                  fVar20 = fVar23;
                }
                fVar23 = pfVar5[1];
                if (fVar23 <= fVar20) {
                  fVar20 = fVar23;
                }
                break;
              case 4:
                fVar20 = expf(-fVar20);
                fVar20 = 1.0 / (fVar20 + 1.0);
                break;
              case 5:
                fVar23 = expf(fVar20);
                fVar23 = logf(fVar23 + 1.0);
                fVar23 = tanhf(fVar23);
LAB_00484fa0:
                fVar20 = fVar20 * fVar23;
              }
              fVar20 = roundf(fVar20 * fVar21);
              iVar11 = (int)fVar20;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              uVar10 = (undefined1)iVar11;
              if (0x7e < iVar11) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17 + sVar7 * sVar8 * uVar15) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar13 != uVar17);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      uVar15 = 0;
      do {
        uVar14 = uVar15 & 0xffffffff;
        uVar17 = uVar14;
        if (this->scale_in_data_size == 1) {
          uVar17 = 0;
        }
        uVar16 = uVar14;
        if (this->scale_out_data_size == 1) {
          uVar16 = 0;
        }
        if (this->bias_data_size == 1) {
          uVar14 = 0;
        }
        if (0 < (int)uVar13) {
          sVar6 = bottom_blob->elemsize;
          sVar7 = top_blob->elemsize;
          fVar22 = *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
          fVar21 = *(float *)((long)(this->scale_out_data).data + uVar16 * 4);
          fVar20 = *(float *)((long)(this->bias_data).data + uVar14 * 4);
          sVar8 = top_blob->cstep;
          pvVar3 = top_blob->data;
          sVar9 = bottom_blob->cstep;
          pvVar4 = bottom_blob->data;
          uVar17 = 0;
          do {
            fVar23 = (float)*(int *)((long)pvVar4 + uVar17 * 4 + sVar6 * sVar9 * uVar15) * fVar22 +
                     fVar20;
            switch(this->activation_type) {
            case 1:
              if (fVar23 <= 0.0) {
                fVar23 = 0.0;
              }
              break;
            case 2:
              fVar19 = (float)(~-(uint)(0.0 < fVar23) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar23) & 0x3f800000);
              goto LAB_00484de5;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar19 = *pfVar5;
              if (fVar23 <= fVar19) {
                fVar23 = fVar19;
              }
              fVar19 = pfVar5[1];
              if (fVar19 <= fVar23) {
                fVar23 = fVar19;
              }
              break;
            case 4:
              fVar23 = expf(-fVar23);
              fVar23 = 1.0 / (fVar23 + 1.0);
              break;
            case 5:
              fVar19 = expf(fVar23);
              fVar19 = logf(fVar19 + 1.0);
              fVar19 = tanhf(fVar19);
LAB_00484de5:
              fVar23 = fVar23 * fVar19;
            }
            fVar23 = roundf(fVar23 * fVar21);
            iVar11 = (int)fVar23;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17 + sVar7 * sVar8 * uVar15) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar1);
    }
    if (bVar18) {
      return -100;
    }
  }
  else if (iVar11 == 2) {
    uVar1 = bottom_blob->w;
    uVar13 = bottom_blob->h;
    Mat::create(top_blob,uVar1,uVar13,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar18 = true;
    }
    else {
      bVar18 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar18) {
      return -100;
    }
    if (this->bias_data_size == 0) {
      if (0 < (int)uVar13) {
        uVar15 = 0;
        do {
          uVar14 = uVar15 & 0xffffffff;
          uVar17 = uVar14;
          if (this->scale_in_data_size == 1) {
            uVar17 = 0;
          }
          if (this->scale_out_data_size == 1) {
            uVar14 = 0;
          }
          if (0 < (int)uVar1) {
            iVar11 = bottom_blob->w;
            iVar2 = top_blob->w;
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
            fVar21 = *(float *)((long)(this->scale_out_data).data + uVar14 * 4);
            sVar6 = top_blob->elemsize;
            pvVar3 = top_blob->data;
            sVar7 = bottom_blob->elemsize;
            pvVar4 = bottom_blob->data;
            uVar17 = 0;
            do {
              fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4 + sVar7 * uVar15 * (long)iVar11) *
                       fVar22;
              switch(this->activation_type) {
              case 1:
                if (fVar20 <= 0.0) {
                  fVar20 = 0.0;
                }
                break;
              case 2:
                fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar20) & 0x3f800000);
                goto LAB_00484b5e;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar23 = *pfVar5;
                if (fVar20 <= fVar23) {
                  fVar20 = fVar23;
                }
                fVar23 = pfVar5[1];
                if (fVar23 <= fVar20) {
                  fVar20 = fVar23;
                }
                break;
              case 4:
                fVar20 = expf(-fVar20);
                fVar20 = 1.0 / (fVar20 + 1.0);
                break;
              case 5:
                fVar23 = expf(fVar20);
                fVar23 = logf(fVar23 + 1.0);
                fVar23 = tanhf(fVar23);
LAB_00484b5e:
                fVar20 = fVar20 * fVar23;
              }
              fVar20 = roundf(fVar20 * fVar21);
              iVar12 = (int)fVar20;
              if (iVar12 < -0x7e) {
                iVar12 = -0x7f;
              }
              uVar10 = (undefined1)iVar12;
              if (0x7e < iVar12) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17 + sVar6 * uVar15 * (long)iVar2) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar1 != uVar17);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar13);
      }
    }
    else if (0 < (int)uVar13) {
      uVar15 = 0;
      do {
        uVar14 = uVar15 & 0xffffffff;
        uVar17 = uVar14;
        if (this->scale_in_data_size == 1) {
          uVar17 = 0;
        }
        uVar16 = uVar14;
        if (this->scale_out_data_size == 1) {
          uVar16 = 0;
        }
        if (this->bias_data_size == 1) {
          uVar14 = 0;
        }
        if (0 < (int)uVar1) {
          iVar11 = bottom_blob->w;
          iVar2 = top_blob->w;
          fVar22 = *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
          fVar21 = *(float *)((long)(this->scale_out_data).data + uVar16 * 4);
          fVar20 = *(float *)((long)(this->bias_data).data + uVar14 * 4);
          sVar6 = top_blob->elemsize;
          pvVar3 = top_blob->data;
          sVar7 = bottom_blob->elemsize;
          pvVar4 = bottom_blob->data;
          uVar17 = 0;
          do {
            fVar23 = (float)*(int *)((long)pvVar4 + uVar17 * 4 + sVar7 * uVar15 * (long)iVar11) *
                     fVar22 + fVar20;
            switch(this->activation_type) {
            case 1:
              if (fVar23 <= 0.0) {
                fVar23 = 0.0;
              }
              break;
            case 2:
              fVar19 = (float)(~-(uint)(0.0 < fVar23) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar23) & 0x3f800000);
              goto LAB_004849a5;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar19 = *pfVar5;
              if (fVar23 <= fVar19) {
                fVar23 = fVar19;
              }
              fVar19 = pfVar5[1];
              if (fVar19 <= fVar23) {
                fVar23 = fVar19;
              }
              break;
            case 4:
              fVar23 = expf(-fVar23);
              fVar23 = 1.0 / (fVar23 + 1.0);
              break;
            case 5:
              fVar19 = expf(fVar23);
              fVar19 = logf(fVar19 + 1.0);
              fVar19 = tanhf(fVar19);
LAB_004849a5:
              fVar23 = fVar23 * fVar19;
            }
            fVar23 = roundf(fVar23 * fVar21);
            iVar12 = (int)fVar23;
            if (iVar12 < -0x7e) {
              iVar12 = -0x7f;
            }
            uVar10 = (undefined1)iVar12;
            if (0x7e < iVar12) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17 + sVar6 * uVar15 * (long)iVar2) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar1 != uVar17);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
    }
    if (bVar18) {
      return -100;
    }
  }
  else if (iVar11 == 1) {
    uVar1 = bottom_blob->w;
    uVar15 = (ulong)uVar1;
    Mat::create(top_blob,uVar1,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    if (pvVar3 == (void *)0x0) {
      bVar18 = true;
    }
    else {
      bVar18 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar18) {
      return -100;
    }
    pvVar4 = bottom_blob->data;
    iVar11 = this->scale_in_data_size;
    iVar2 = this->scale_out_data_size;
    if (iVar2 == 1 && iVar11 == 1) {
      fVar22 = *(this->scale_in_data).data;
      fVar21 = *(this->scale_out_data).data;
      if (this->bias_data_size == 1) {
        if (0 < (int)uVar1) {
          fVar20 = *(this->bias_data).data;
          uVar17 = 0;
          do {
            fVar23 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22 + fVar20;
            switch(this->activation_type) {
            case 1:
              if (fVar23 <= 0.0) {
                fVar23 = 0.0;
              }
              break;
            case 2:
              fVar19 = (float)(~-(uint)(0.0 < fVar23) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar23) & 0x3f800000);
              goto LAB_00483da8;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar19 = *pfVar5;
              if (fVar23 <= fVar19) {
                fVar23 = fVar19;
              }
              fVar19 = pfVar5[1];
              if (fVar19 <= fVar23) {
                fVar23 = fVar19;
              }
              break;
            case 4:
              fVar23 = expf(-fVar23);
              fVar23 = 1.0 / (fVar23 + 1.0);
              break;
            case 5:
              fVar19 = expf(fVar23);
              fVar19 = logf(fVar19 + 1.0);
              fVar19 = tanhf(fVar19);
LAB_00483da8:
              fVar23 = fVar23 * fVar19;
            }
            fVar23 = roundf(fVar23 * fVar21);
            iVar11 = (int)fVar23;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (this->bias_data_size == 0) {
        if (0 < (int)uVar1) {
          uVar17 = 0;
          do {
            fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22;
            switch(this->activation_type) {
            case 1:
              if (fVar20 <= 0.0) {
                fVar20 = 0.0;
              }
              break;
            case 2:
              fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar20) & 0x3f800000);
              goto LAB_004839b9;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar23 = *pfVar5;
              if (fVar20 <= fVar23) {
                fVar20 = fVar23;
              }
              fVar23 = pfVar5[1];
              if (fVar23 <= fVar20) {
                fVar20 = fVar23;
              }
              break;
            case 4:
              fVar20 = expf(-fVar20);
              fVar20 = 1.0 / (fVar20 + 1.0);
              break;
            case 5:
              fVar23 = expf(fVar20);
              fVar23 = logf(fVar23 + 1.0);
              fVar23 = tanhf(fVar23);
LAB_004839b9:
              fVar20 = fVar20 * fVar23;
            }
            fVar20 = roundf(fVar20 * fVar21);
            iVar11 = (int)fVar20;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (0 < (int)uVar1) {
        uVar17 = 0;
        do {
          fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22 +
                   *(float *)((long)(this->bias_data).data + uVar17 * 4);
          switch(this->activation_type) {
          case 1:
            if (fVar20 <= 0.0) {
              fVar20 = 0.0;
            }
            break;
          case 2:
            fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                            -(uint)(0.0 < fVar20) & 0x3f800000);
            goto LAB_00483ec8;
          case 3:
            pfVar5 = (float *)(this->activation_params).data;
            fVar23 = *pfVar5;
            if (fVar20 <= fVar23) {
              fVar20 = fVar23;
            }
            fVar23 = pfVar5[1];
            if (fVar23 <= fVar20) {
              fVar20 = fVar23;
            }
            break;
          case 4:
            fVar20 = expf(-fVar20);
            fVar20 = 1.0 / (fVar20 + 1.0);
            break;
          case 5:
            fVar23 = expf(fVar20);
            fVar23 = logf(fVar23 + 1.0);
            fVar23 = tanhf(fVar23);
LAB_00483ec8:
            fVar20 = fVar20 * fVar23;
          }
          fVar20 = roundf(fVar20 * fVar21);
          iVar11 = (int)fVar20;
          if (iVar11 < -0x7e) {
            iVar11 = -0x7f;
          }
          uVar10 = (undefined1)iVar11;
          if (0x7e < iVar11) {
            uVar10 = 0x7f;
          }
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    else if (iVar2 < 2 || iVar11 != 1) {
      if (iVar11 < 2 || iVar2 != 1) {
        if (this->bias_data_size == 1) {
          if (0 < (int)uVar1) {
            fVar22 = *(this->bias_data).data;
            uVar17 = 0;
            do {
              fVar21 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                       *(float *)((long)(this->scale_in_data).data + uVar17 * 4) + fVar22;
              switch(this->activation_type) {
              case 1:
                if (fVar21 <= 0.0) {
                  fVar21 = 0.0;
                }
                break;
              case 2:
                fVar20 = (float)(~-(uint)(0.0 < fVar21) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar21) & 0x3f800000);
                goto LAB_004844e0;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar20 = *pfVar5;
                if (fVar21 <= fVar20) {
                  fVar21 = fVar20;
                }
                fVar20 = pfVar5[1];
                if (fVar20 <= fVar21) {
                  fVar21 = fVar20;
                }
                break;
              case 4:
                fVar21 = expf(-fVar21);
                fVar21 = 1.0 / (fVar21 + 1.0);
                break;
              case 5:
                fVar20 = expf(fVar21);
                fVar20 = logf(fVar20 + 1.0);
                fVar20 = tanhf(fVar20);
LAB_004844e0:
                fVar21 = fVar21 * fVar20;
              }
              fVar21 = roundf(fVar21 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
              iVar11 = (int)fVar21;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              uVar10 = (undefined1)iVar11;
              if (0x7e < iVar11) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
        }
        else if (this->bias_data_size == 0) {
          if (0 < (int)uVar1) {
            uVar17 = 0;
            do {
              fVar22 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                       *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
              switch(this->activation_type) {
              case 1:
                if (fVar22 <= 0.0) {
                  fVar22 = 0.0;
                }
                break;
              case 2:
                fVar21 = (float)(~-(uint)(0.0 < fVar22) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar22) & 0x3f800000);
                goto LAB_00484003;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar21 = *pfVar5;
                if (fVar22 <= fVar21) {
                  fVar22 = fVar21;
                }
                fVar21 = pfVar5[1];
                if (fVar21 <= fVar22) {
                  fVar22 = fVar21;
                }
                break;
              case 4:
                fVar22 = expf(-fVar22);
                fVar22 = 1.0 / (fVar22 + 1.0);
                break;
              case 5:
                fVar21 = expf(fVar22);
                fVar21 = logf(fVar21 + 1.0);
                fVar21 = tanhf(fVar21);
LAB_00484003:
                fVar22 = fVar22 * fVar21;
              }
              fVar22 = roundf(fVar22 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
              iVar11 = (int)fVar22;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              uVar10 = (undefined1)iVar11;
              if (0x7e < iVar11) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
        }
        else if (0 < (int)uVar1) {
          uVar17 = 0;
          do {
            fVar22 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                     *(float *)((long)(this->scale_in_data).data + uVar17 * 4) +
                     *(float *)((long)(this->bias_data).data + uVar17 * 4);
            switch(this->activation_type) {
            case 1:
              if (fVar22 <= 0.0) {
                fVar22 = 0.0;
              }
              break;
            case 2:
              fVar21 = (float)(~-(uint)(0.0 < fVar22) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar22) & 0x3f800000);
              goto LAB_0048473c;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar21 = *pfVar5;
              if (fVar22 <= fVar21) {
                fVar22 = fVar21;
              }
              fVar21 = pfVar5[1];
              if (fVar21 <= fVar22) {
                fVar22 = fVar21;
              }
              break;
            case 4:
              fVar22 = expf(-fVar22);
              fVar22 = 1.0 / (fVar22 + 1.0);
              break;
            case 5:
              fVar21 = expf(fVar22);
              fVar21 = logf(fVar21 + 1.0);
              fVar21 = tanhf(fVar21);
LAB_0048473c:
              fVar22 = fVar22 * fVar21;
            }
            fVar22 = roundf(fVar22 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
            iVar11 = (int)fVar22;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else {
        fVar22 = *(this->scale_out_data).data;
        if (this->bias_data_size == 1) {
          if (0 < (int)uVar1) {
            fVar21 = *(this->bias_data).data;
            uVar17 = 0;
            do {
              fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                       *(float *)((long)(this->scale_in_data).data + uVar17 * 4) + fVar21;
              switch(this->activation_type) {
              case 1:
                if (fVar20 <= 0.0) {
                  fVar20 = 0.0;
                }
                break;
              case 2:
                fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar20) & 0x3f800000);
                goto LAB_004843a5;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar23 = *pfVar5;
                if (fVar20 <= fVar23) {
                  fVar20 = fVar23;
                }
                fVar23 = pfVar5[1];
                if (fVar23 <= fVar20) {
                  fVar20 = fVar23;
                }
                break;
              case 4:
                fVar20 = expf(-fVar20);
                fVar20 = 1.0 / (fVar20 + 1.0);
                break;
              case 5:
                fVar23 = expf(fVar20);
                fVar23 = logf(fVar23 + 1.0);
                fVar23 = tanhf(fVar23);
LAB_004843a5:
                fVar20 = fVar20 * fVar23;
              }
              fVar20 = roundf(fVar20 * fVar22);
              iVar11 = (int)fVar20;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              uVar10 = (undefined1)iVar11;
              if (0x7e < iVar11) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
        }
        else if (this->bias_data_size == 0) {
          if (0 < (int)uVar1) {
            uVar17 = 0;
            do {
              fVar21 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                       *(float *)((long)(this->scale_in_data).data + uVar17 * 4);
              switch(this->activation_type) {
              case 1:
                if (fVar21 <= 0.0) {
                  fVar21 = 0.0;
                }
                break;
              case 2:
                fVar20 = (float)(~-(uint)(0.0 < fVar21) & *(this->activation_params).data |
                                -(uint)(0.0 < fVar21) & 0x3f800000);
                goto LAB_00483c77;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar20 = *pfVar5;
                if (fVar21 <= fVar20) {
                  fVar21 = fVar20;
                }
                fVar20 = pfVar5[1];
                if (fVar20 <= fVar21) {
                  fVar21 = fVar20;
                }
                break;
              case 4:
                fVar21 = expf(-fVar21);
                fVar21 = 1.0 / (fVar21 + 1.0);
                break;
              case 5:
                fVar20 = expf(fVar21);
                fVar20 = logf(fVar20 + 1.0);
                fVar20 = tanhf(fVar20);
LAB_00483c77:
                fVar21 = fVar21 * fVar20;
              }
              fVar21 = roundf(fVar21 * fVar22);
              iVar11 = (int)fVar21;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              uVar10 = (undefined1)iVar11;
              if (0x7e < iVar11) {
                uVar10 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
        }
        else if (0 < (int)uVar1) {
          uVar17 = 0;
          do {
            fVar21 = (float)*(int *)((long)pvVar4 + uVar17 * 4) *
                     *(float *)((long)(this->scale_in_data).data + uVar17 * 4) +
                     *(float *)((long)(this->bias_data).data + uVar17 * 4);
            switch(this->activation_type) {
            case 1:
              if (fVar21 <= 0.0) {
                fVar21 = 0.0;
              }
              break;
            case 2:
              fVar20 = (float)(~-(uint)(0.0 < fVar21) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar21) & 0x3f800000);
              goto LAB_0048460c;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar20 = *pfVar5;
              if (fVar21 <= fVar20) {
                fVar21 = fVar20;
              }
              fVar20 = pfVar5[1];
              if (fVar20 <= fVar21) {
                fVar21 = fVar20;
              }
              break;
            case 4:
              fVar21 = expf(-fVar21);
              fVar21 = 1.0 / (fVar21 + 1.0);
              break;
            case 5:
              fVar20 = expf(fVar21);
              fVar20 = logf(fVar20 + 1.0);
              fVar20 = tanhf(fVar20);
LAB_0048460c:
              fVar21 = fVar21 * fVar20;
            }
            fVar21 = roundf(fVar21 * fVar22);
            iVar11 = (int)fVar21;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
    }
    else {
      fVar22 = *(this->scale_in_data).data;
      if (this->bias_data_size == 1) {
        if (0 < (int)uVar1) {
          fVar21 = *(this->bias_data).data;
          uVar17 = 0;
          do {
            fVar20 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22 + fVar21;
            switch(this->activation_type) {
            case 1:
              if (fVar20 <= 0.0) {
                fVar20 = 0.0;
              }
              break;
            case 2:
              fVar23 = (float)(~-(uint)(0.0 < fVar20) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar20) & 0x3f800000);
              goto LAB_0048413e;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar23 = *pfVar5;
              if (fVar20 <= fVar23) {
                fVar20 = fVar23;
              }
              fVar23 = pfVar5[1];
              if (fVar23 <= fVar20) {
                fVar20 = fVar23;
              }
              break;
            case 4:
              fVar20 = expf(-fVar20);
              fVar20 = 1.0 / (fVar20 + 1.0);
              break;
            case 5:
              fVar23 = expf(fVar20);
              fVar23 = logf(fVar23 + 1.0);
              fVar23 = tanhf(fVar23);
LAB_0048413e:
              fVar20 = fVar20 * fVar23;
            }
            fVar20 = roundf(fVar20 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
            iVar11 = (int)fVar20;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (this->bias_data_size == 0) {
        if (0 < (int)uVar1) {
          uVar17 = 0;
          do {
            fVar21 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22;
            switch(this->activation_type) {
            case 1:
              if (fVar21 <= 0.0) {
                fVar21 = 0.0;
              }
              break;
            case 2:
              fVar20 = (float)(~-(uint)(0.0 < fVar21) & *(this->activation_params).data |
                              -(uint)(0.0 < fVar21) & 0x3f800000);
              goto LAB_00483b19;
            case 3:
              pfVar5 = (float *)(this->activation_params).data;
              fVar20 = *pfVar5;
              if (fVar21 <= fVar20) {
                fVar21 = fVar20;
              }
              fVar20 = pfVar5[1];
              if (fVar20 <= fVar21) {
                fVar21 = fVar20;
              }
              break;
            case 4:
              fVar21 = expf(-fVar21);
              fVar21 = 1.0 / (fVar21 + 1.0);
              break;
            case 5:
              fVar20 = expf(fVar21);
              fVar20 = logf(fVar20 + 1.0);
              fVar20 = tanhf(fVar20);
LAB_00483b19:
              fVar21 = fVar21 * fVar20;
            }
            fVar21 = roundf(fVar21 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
            iVar11 = (int)fVar21;
            if (iVar11 < -0x7e) {
              iVar11 = -0x7f;
            }
            uVar10 = (undefined1)iVar11;
            if (0x7e < iVar11) {
              uVar10 = 0x7f;
            }
            *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (0 < (int)uVar1) {
        uVar17 = 0;
        do {
          fVar21 = (float)*(int *)((long)pvVar4 + uVar17 * 4) * fVar22 +
                   *(float *)((long)(this->bias_data).data + uVar17 * 4);
          switch(this->activation_type) {
          case 1:
            if (fVar21 <= 0.0) {
              fVar21 = 0.0;
            }
            break;
          case 2:
            fVar20 = (float)(~-(uint)(0.0 < fVar21) & *(this->activation_params).data |
                            -(uint)(0.0 < fVar21) & 0x3f800000);
            goto LAB_0048426e;
          case 3:
            pfVar5 = (float *)(this->activation_params).data;
            fVar20 = *pfVar5;
            if (fVar21 <= fVar20) {
              fVar21 = fVar20;
            }
            fVar20 = pfVar5[1];
            if (fVar20 <= fVar21) {
              fVar21 = fVar20;
            }
            break;
          case 4:
            fVar21 = expf(-fVar21);
            fVar21 = 1.0 / (fVar21 + 1.0);
            break;
          case 5:
            fVar20 = expf(fVar21);
            fVar20 = logf(fVar20 + 1.0);
            fVar20 = tanhf(fVar20);
LAB_0048426e:
            fVar21 = fVar21 * fVar20;
          }
          fVar21 = roundf(fVar21 * *(float *)((long)(this->scale_out_data).data + uVar17 * 4));
          iVar11 = (int)fVar21;
          if (iVar11 < -0x7e) {
            iVar11 = -0x7f;
          }
          uVar10 = (undefined1)iVar11;
          if (0x7e < iVar11) {
            uVar10 = 0x7f;
          }
          *(undefined1 *)((long)pvVar3 + uVar17) = uVar10;
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    if (bVar18) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        if (scale_in_data_size == 1 && scale_out_data_size == 1)
        {
            const float scale_in = scale_in_data[0];
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else if (scale_in_data_size == 1 && scale_out_data_size > 1)
        {
            const float scale_in = scale_in_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
        else if (scale_in_data_size > 1 && scale_out_data_size == 1)
        {
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else // if (scale_in_data_size > 1 && scale_out_data_size > 1)
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in + bias;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    return 0;
}